

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaBalAig.c
# Opt level: O1

void Gia_ManSimplifyXor(Vec_Int_t *vSuper)

{
  int iVar1;
  int *piVar2;
  uint uVar3;
  long lVar4;
  uint Entry;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  
  uVar6 = vSuper->nSize;
  uVar7 = (ulong)uVar6;
  if ((int)uVar6 < 1) {
    uVar3 = 0;
    Entry = 0;
  }
  else {
    piVar2 = vSuper->pArray;
    iVar5 = -1;
    lVar4 = 0;
    Entry = 0;
    uVar3 = 0;
    do {
      iVar1 = piVar2[lVar4];
      if (iVar1 != 0) {
        if (iVar1 == 1) {
          Entry = Entry ^ 1;
        }
        else if (iVar5 == iVar1) {
          uVar3 = uVar3 - 1;
          iVar5 = -1;
        }
        else {
          if (((int)uVar3 < 0) || ((int)uVar7 <= (int)uVar3)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                          ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
          uVar7 = (ulong)uVar3;
          uVar3 = uVar3 + 1;
          piVar2[uVar7] = iVar1;
          iVar5 = iVar1;
        }
      }
      lVar4 = lVar4 + 1;
      uVar6 = vSuper->nSize;
      uVar7 = (ulong)(int)uVar6;
    } while (lVar4 < (long)uVar7);
  }
  if ((int)uVar6 < (int)uVar3) {
    __assert_fail("p->nSize >= nSizeNew",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                  ,0x2ac,"void Vec_IntShrink(Vec_Int_t *, int)");
  }
  vSuper->nSize = uVar3;
  if (uVar3 == 0) {
    Vec_IntPush(vSuper,Entry);
    return;
  }
  if (Entry != 0) {
    if ((int)uVar3 < 1) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                    ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    uVar6 = *vSuper->pArray;
    if ((int)uVar6 < 0) {
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                    ,0x10e,"int Abc_LitNot(int)");
    }
    *vSuper->pArray = uVar6 ^ 1;
  }
  return;
}

Assistant:

void Gia_ManSimplifyXor( Vec_Int_t * vSuper )
{
    int i, k = 0, Prev = -1, This, fCompl = 0;
    Vec_IntForEachEntry( vSuper, This, i )
    {
        if ( This == 0 )
            continue;
        if ( This == 1 )
            fCompl ^= 1; 
        else if ( Prev != This )
            Vec_IntWriteEntry( vSuper, k++, This ), Prev = This;
        else
            Prev = -1, k--;
    }
    Vec_IntShrink( vSuper, k );
    if ( Vec_IntSize( vSuper ) == 0 )
        Vec_IntPush( vSuper, fCompl );
    else if ( fCompl )
        Vec_IntWriteEntry( vSuper, 0, Abc_LitNot(Vec_IntEntry(vSuper, 0)) );
}